

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# if.h
# Opt level: O2

word * If_CutTruthW(If_Man_t *p,If_Cut_t *pCut)

{
  word *pOut;
  word *pIn;
  
  if (pCut->iCutFunc < 0) {
    __assert_fail("pCut->iCutFunc >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/if.h"
                  ,0x1b8,"word *If_CutTruthW(If_Man_t *, If_Cut_t *)");
  }
  pOut = p->puTempW;
  pIn = If_CutTruthWR(p,pCut);
  if (-1 < pCut->iCutFunc) {
    Abc_TtCopy(pOut,pIn,p->nTruth6Words[(byte)pCut->field_0x1f],pCut->iCutFunc & 1);
    return p->puTempW;
  }
  __assert_fail("pCut->iCutFunc >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/if.h"
                ,0x1b5,"int If_CutTruthIsCompl(If_Cut_t *)");
}

Assistant:

static inline word *     If_CutTruthW( If_Man_t * p, If_Cut_t * pCut )       { assert( pCut->iCutFunc >= 0 ); Abc_TtCopy( p->puTempW, If_CutTruthWR(p, pCut), p->nTruth6Words[pCut->nLeaves], If_CutTruthIsCompl(pCut) ); return p->puTempW;  }